

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeXYZ.cpp
# Opt level: O2

void __thiscall chrono::ChNodeXYZ::ArchiveIN(ChNodeXYZ *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChNodeXYZ>(marchive);
  ChNodeBase::ArchiveIN
            ((ChNodeBase *)
             ((long)(this->pos).m_data + *(long *)((long)this->super_ChLoadableUVW + -0x80) + -8),
             marchive);
  local_30._value = &this->pos;
  local_30._name = "pos";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->pos_dt;
  local_48._name = "pos_dt";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->pos_dtdt;
  local_60._name = "pos_dtdt";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChNodeXYZ::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChNodeXYZ>();

    // deserialize parent class:
    ChNodeBase::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(pos);
    marchive >> CHNVP(pos_dt);
    marchive >> CHNVP(pos_dtdt);
}